

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

int __thiscall Token::param(Token *this)

{
  int iVar1;
  size_t sVar2;
  undefined4 *puVar3;
  string local_30;
  Token *local_10;
  Token *this_local;
  
  local_10 = this;
  sVar2 = size(this);
  if (sVar2 < 2) {
    puVar3 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar3 = 0xfffffffe;
    __cxa_throw(puVar3,&int::typeinfo,0);
  }
  operator[][abi_cxx11_(&local_30,this,3);
  iVar1 = std::__cxx11::stoi(&local_30,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

int Token::param() const {
    if (size() < 2) throw -2;

    return std::stoi((*this)[3]);
}